

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelloWorld.cpp
# Opt level: O0

path * findDocRoot(string *filename)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  byte bVar1;
  byte bVar2;
  runtime_error *this;
  char *in_RSI;
  path *in_RDI;
  iterator element;
  path cp;
  path *webfront;
  path *in_stack_fffffffffffffc08;
  undefined7 in_stack_fffffffffffffc10;
  byte in_stack_fffffffffffffc17;
  path *in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc20;
  byte in_stack_fffffffffffffc27;
  size_t in_stack_fffffffffffffc28;
  reference in_stack_fffffffffffffc30;
  reference in_stack_fffffffffffffc38;
  undefined6 in_stack_fffffffffffffc40;
  undefined1 in_stack_fffffffffffffc46;
  undefined7 in_stack_fffffffffffffc50;
  path *__source;
  path *this_00;
  string local_360 [200];
  path local_298 [5];
  byte local_1c1;
  path local_68 [2];
  
  __source = in_RDI;
  ::webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             (char *)in_stack_fffffffffffffc18);
  this_00 = local_68;
  std::filesystem::current_path_abi_cxx11_();
  ::webfront::http::std::filesystem::__cxx11::path::string(in_stack_fffffffffffffc38);
  fmt_01._M_str = (char *)in_stack_fffffffffffffc30;
  fmt_01._M_len = in_stack_fffffffffffffc28;
  ::webfront::log::info<std::__cxx11::string&,std::__cxx11::string>
            (fmt_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
             &in_stack_fffffffffffffc18->_M_pathname);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
  ::webfront::http::std::filesystem::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
  std::filesystem::current_path_abi_cxx11_();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (this_00,&__source->_M_pathname,(format)((ulong)in_RDI >> 0x38));
  ::webfront::http::std::filesystem::__cxx11::operator/
            (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
  bVar1 = ::webfront::http::std::filesystem::exists
                    ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
  ::webfront::http::std::filesystem::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
  ::webfront::http::std::filesystem::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
  ::webfront::http::std::filesystem::__cxx11::path::~path
            ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
  if ((bVar1 & 1) == 0) {
    ::webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
               (char *)in_stack_fffffffffffffc18);
    std::filesystem::temp_directory_path_abi_cxx11_();
    ::webfront::http::std::filesystem::__cxx11::path::string(in_stack_fffffffffffffc38);
    fmt._M_str._0_7_ = in_stack_fffffffffffffc20;
    fmt._M_len = (size_t)in_stack_fffffffffffffc18;
    fmt._M_str._7_1_ = in_stack_fffffffffffffc27;
    ::webfront::log::info<std::__cxx11::string>
              (fmt,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
    ::webfront::http::std::filesystem::__cxx11::path::~path
              ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
    std::filesystem::temp_directory_path_abi_cxx11_();
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (this_00,&__source->_M_pathname,(format)((ulong)in_RDI >> 0x38));
    ::webfront::http::std::filesystem::__cxx11::operator/
              (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    bVar2 = ::webfront::http::std::filesystem::exists
                      ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
    ::webfront::http::std::filesystem::__cxx11::path::~path
              ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
    ::webfront::http::std::filesystem::__cxx11::path::~path
              ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
    ::webfront::http::std::filesystem::__cxx11::path::~path
              ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
    if ((bVar2 & 1) == 0) {
      local_1c1 = 0;
      ::webfront::http::std::filesystem::__cxx11::path::path
                ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
      std::filesystem::current_path_abi_cxx11_();
      ::webfront::http::std::filesystem::__cxx11::path::begin
                ((path *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
      do {
        ::webfront::http::std::filesystem::__cxx11::path::end
                  ((path *)CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20));
        in_stack_fffffffffffffc46 =
             ::webfront::http::std::filesystem::__cxx11::operator!=
                       ((iterator *)
                        CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffc46,in_stack_fffffffffffffc40)
                                ),(iterator *)in_stack_fffffffffffffc38);
        if (!(bool)in_stack_fffffffffffffc46) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(in_RSI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(bVar1,in_stack_fffffffffffffc50));
          std::operator+(&in_stack_fffffffffffffc18->_M_pathname,
                         (char *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          std::runtime_error::runtime_error(this,local_360);
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        in_stack_fffffffffffffc38 =
             ::webfront::http::std::filesystem::__cxx11::path::iterator::operator*
                       ((iterator *)in_stack_fffffffffffffc08);
        ::webfront::http::std::filesystem::__cxx11::operator/
                  (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
        ::webfront::http::std::filesystem::__cxx11::path::operator=
                  (in_stack_fffffffffffffc18,
                   (path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
        ::webfront::http::std::filesystem::__cxx11::path::~path
                  ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
        in_stack_fffffffffffffc30 =
             ::webfront::http::std::filesystem::__cxx11::path::iterator::operator*
                       ((iterator *)in_stack_fffffffffffffc08);
        std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
                  (this_00,(char (*) [9])__source,(format)((ulong)in_RDI >> 0x38));
        in_stack_fffffffffffffc27 =
             ::webfront::http::std::filesystem::__cxx11::operator==
                       ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10),
                        in_stack_fffffffffffffc08);
        ::webfront::http::std::filesystem::__cxx11::path::~path
                  ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
        if ((in_stack_fffffffffffffc27 & 1) != 0) {
          std::filesystem::__cxx11::path::path<char[4],std::filesystem::__cxx11::path>
                    (this_00,(char (*) [4])__source,(format)((ulong)in_RDI >> 0x38));
          ::webfront::http::std::filesystem::__cxx11::operator/
                    (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
          in_stack_fffffffffffffc18 = local_298;
          ::webfront::http::std::filesystem::__cxx11::path::operator=
                    (in_stack_fffffffffffffc18,
                     (path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          ::webfront::http::std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          ::webfront::http::std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          ::webfront::http::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc27,in_stack_fffffffffffffc20),
                     (char *)in_stack_fffffffffffffc18);
          ::webfront::http::std::filesystem::__cxx11::path::string(in_stack_fffffffffffffc38);
          fmt_00._M_str._0_7_ = in_stack_fffffffffffffc20;
          fmt_00._M_len = (size_t)in_stack_fffffffffffffc18;
          fmt_00._M_str._7_1_ = in_stack_fffffffffffffc27;
          ::webfront::log::info<std::__cxx11::string>
                    (fmt_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                    (this_00,&__source->_M_pathname,(format)((ulong)in_RDI >> 0x38));
          ::webfront::http::std::filesystem::__cxx11::operator/
                    (in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
          in_stack_fffffffffffffc17 =
               ::webfront::http::std::filesystem::exists
                         ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          ::webfront::http::std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          ::webfront::http::std::filesystem::__cxx11::path::~path
                    ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
          if ((in_stack_fffffffffffffc17 & 1) != 0) {
            local_1c1 = 1;
            ::webfront::http::std::filesystem::__cxx11::path::~path
                      ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
            if ((local_1c1 & 1) != 0) {
              return __source;
            }
            ::webfront::http::std::filesystem::__cxx11::path::~path
                      ((path *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
            return __source;
          }
        }
        ::webfront::http::std::filesystem::__cxx11::path::iterator::operator++
                  ((iterator *)CONCAT17(in_stack_fffffffffffffc17,in_stack_fffffffffffffc10));
      } while( true );
    }
    std::filesystem::temp_directory_path_abi_cxx11_();
  }
  else {
    std::filesystem::current_path_abi_cxx11_();
  }
  return __source;
}

Assistant:

filesystem::path findDocRoot(string filename) {
    using namespace filesystem;

    log::info("Looking for {} in {}", filename, current_path().string());
    if (exists(current_path() / filename)) return current_path();

    log::info("  not found : Looking now in temp directory {} ", temp_directory_path().string());
    if (exists(temp_directory_path() / filename)) return temp_directory_path();

    path webfront, cp{current_path()};
    for (auto element = cp.begin(); element != cp.end(); ++element) {
        webfront = webfront / *element;
        if (*element == "WebFront") {
            webfront = webfront / "src";
            log::info("  not found : Looking now in source directory {}", webfront.string());
            if (exists(webfront / filename)) return webfront;
        }
    }

    throw runtime_error("Cannot find " + filename + " file");
}